

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal64.c
# Opt level: O3

decimal64 * decimal64FromString(decimal64 *result,char *string,decContext *set)

{
  decNumber_conflict2 dn;
  decContext dc;
  decNumber_conflict2 local_5c;
  decContext local_44;
  
  decContextDefault(&local_44,0x40);
  local_44.round = set->round;
  decNumberFromString((decNumber_conflict *)&local_5c,string,&local_44);
  decimal64FromNumber(result,&local_5c,&local_44);
  if (local_44.status != 0) {
    decContextSetStatus(set,local_44.status);
  }
  return result;
}

Assistant:

decimal64 * decimal64FromString(decimal64 *result, const char *string,
				decContext *set) {
  decContext dc;			     /* work */
  decNumber dn;				     /* .. */

  decContextDefault(&dc, DEC_INIT_DECIMAL64); /* no traps, please */
  dc.round=set->round;			      /* use supplied rounding */

  decNumberFromString(&dn, string, &dc);     /* will round if needed */

  decimal64FromNumber(result, &dn, &dc);
  if (dc.status!=0) {			     /* something happened */
    decContextSetStatus(set, dc.status);     /* .. pass it on */
    }
  return result;
  }